

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interlink.cpp
# Opt level: O0

void __thiscall indk::Interlink::doUpdateStructure(Interlink *this,string *data)

{
  allocator local_39;
  string local_38;
  string *local_18;
  string *data_local;
  Interlink *this_local;
  
  local_18 = data;
  data_local = (string *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_38,"io_app_update_structure",&local_39);
  doSend(this,&local_38,local_18);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  return;
}

Assistant:

void indk::Interlink::doUpdateStructure(const std::string &data) {
    doSend("io_app_update_structure", data);
}